

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O2

uint8_t * ChunkEmit(WebPChunk *chunk,uint8_t *dst)

{
  uint32_t uVar1;
  ulong __n;
  
  __n = (chunk->data).size;
  uVar1 = chunk->tag;
  *dst = (uint8_t)uVar1;
  dst[1] = (uint8_t)(uVar1 >> 8);
  dst[2] = (uint8_t)(uVar1 >> 0x10);
  dst[3] = (uint8_t)(uVar1 >> 0x18);
  dst[4] = (uint8_t)__n;
  dst[5] = (uint8_t)(__n >> 8);
  dst[6] = (uint8_t)(__n >> 0x10);
  dst[7] = (uint8_t)(__n >> 0x18);
  memcpy(dst + 8,(chunk->data).bytes,__n);
  if ((__n & 1) != 0) {
    dst[__n + 8] = '\0';
  }
  return dst + (ulong)((int)(chunk->data).size + 1U & 0xfffffffe) + 8;
}

Assistant:

static uint8_t* ChunkEmit(const WebPChunk* const chunk, uint8_t* dst) {
  const size_t chunk_size = chunk->data.size;
  assert(chunk);
  assert(chunk->tag != NIL_TAG);
  PutLE32(dst + 0, chunk->tag);
  PutLE32(dst + TAG_SIZE, (uint32_t)chunk_size);
  assert(chunk_size == (uint32_t)chunk_size);
  memcpy(dst + CHUNK_HEADER_SIZE, chunk->data.bytes, chunk_size);
  if (chunk_size & 1)
    dst[CHUNK_HEADER_SIZE + chunk_size] = 0;  // Add padding.
  return dst + ChunkDiskSize(chunk);
}